

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O3

void __thiscall AVO::Simulator::doStep(Simulator *this)

{
  pointer ppAVar1;
  int iVar2;
  long lVar3;
  
  KdTree::buildAgentTree(this->kdTree_);
  ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar3 = 0;
    do {
      Agent::computeNeighbors(ppAVar1[lVar3],this->kdTree_);
      Agent::computeNewVelocity
                ((this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3],this->timeStep_);
      lVar3 = lVar3 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar2 = (int)((ulong)((long)(this->agents_).
                                  super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3);
    } while (lVar3 < iVar2);
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        Agent::update(ppAVar1[lVar3],this->timeStep_);
        lVar3 = lVar3 + 1;
        ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)(this->agents_).
                                           super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppAVar1) >> 3));
    }
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void Simulator::doStep() {
  kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->computeNeighbors(kdTree_);
    agents_[agentNo]->computeNewVelocity(timeStep_);
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->update(timeStep_);
  }

  globalTime_ += timeStep_;
}